

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint Kit_DsdNonDsdSupports(Kit_DsdNtk_t *pNtk)

{
  int Lit;
  uint uVar1;
  bool bVar2;
  uint local_20;
  uint local_1c;
  uint uSupport;
  uint i;
  Kit_DsdObj_t *pObj;
  Kit_DsdNtk_t *pNtk_local;
  
  local_20 = 0;
  Kit_DsdGetSupports(pNtk);
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < pNtk->nNodes) {
      _uSupport = pNtk->pNodes[local_1c];
      bVar2 = _uSupport != (Kit_DsdObj_t *)0x0;
    }
    if (!bVar2) break;
    if (((uint)*_uSupport >> 6 & 7) == 5) {
      Lit = Abc_Var2Lit((uint)*_uSupport & 0x3f,0);
      uVar1 = Kit_DsdLitSupport(pNtk,Lit);
      local_20 = uVar1 | local_20;
    }
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

unsigned Kit_DsdNonDsdSupports( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i, uSupport = 0;
//    ABC_FREE( pNtk->pSupps );
    Kit_DsdGetSupports( pNtk );
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        uSupport |= Kit_DsdLitSupport( pNtk, Abc_Var2Lit(pObj->Id,0) );
    }
    return uSupport;
}